

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOperatorReader.cpp
# Opt level: O0

void __thiscall IOperatorReader::getWord(IOperatorReader *this,string *str)

{
  char ch;
  bool bVar1;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  int local_80;
  int local_7c;
  int i;
  int maxLen;
  byte local_41;
  string local_40 [7];
  bool first_flag;
  string tempStr;
  char local_19;
  char tempChar;
  string *str_local;
  IOperatorReader *this_local;
  
  std::__cxx11::string::string(local_40);
  local_41 = 1;
  while (ch = std::istream::get(), ch != -1) {
    bVar1 = IDictionary::isOperator(ch);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)str,ch);
    }
    else {
      if (((local_41 & 1) == 0) || (bVar1 = IDictionary::isBracket1l(ch), !bVar1)) break;
      std::__cxx11::string::operator+=((string *)str,ch);
      while ((local_19 = std::istream::get(), local_19 != -1 &&
             (bVar1 = IDictionary::isBlankSep(local_19), bVar1))) {
        std::__cxx11::string::operator+=((string *)str,local_19);
        if (local_19 == '\n') {
          std::__cxx11::string::operator+=((string *)str,'\n');
        }
      }
      do {
        bVar1 = IDictionary::isLetterOrNumberOrDL(local_19);
        if (!bVar1) break;
        std::__cxx11::string::operator+=((string *)str,local_19);
        local_19 = std::istream::get();
      } while (local_19 != -1);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&i,(ulong)str);
      bVar1 = IDictionary::isBaseType((string *)&i);
      std::__cxx11::string::~string((string *)&i);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        do {
          bVar1 = IDictionary::isBlankSep(local_19);
          if (!bVar1) break;
          std::__cxx11::string::operator+=((string *)str,local_19);
          if (local_19 == '\n') {
            std::__cxx11::string::operator+=((string *)str,'\n');
          }
          local_19 = std::istream::get();
        } while (local_19 != -1);
        bVar1 = IDictionary::isBracket1r(local_19);
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)str,local_19);
          this->m_type = this->m_type | 2;
          break;
        }
        std::__cxx11::string::operator=((string *)str,"");
      }
      else {
        std::__cxx11::string::operator=((string *)str,"");
      }
    }
    local_41 = 0;
  }
  std::__cxx11::string::operator=(local_40,(string *)str);
  local_7c = std::__cxx11::string::length();
  for (local_80 = 0; local_80 < local_7c; local_80 = local_80 + 1) {
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_40);
    std::__cxx11::string::operator=((string *)str,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::string(local_c0,(string *)str);
    bVar1 = IDictionary::isOperator0((string *)local_c0);
    std::__cxx11::string::~string(local_c0);
    if (bVar1) {
      this->m_type = this->m_type | 1;
    }
    std::__cxx11::string::string(local_e0,(string *)str);
    bVar1 = IDictionary::isOperator1((string *)local_e0);
    std::__cxx11::string::~string(local_e0);
    if (bVar1) {
      this->m_type = this->m_type | 2;
    }
    std::__cxx11::string::string(local_100,(string *)str);
    bVar1 = IDictionary::isOperator2((string *)local_100);
    std::__cxx11::string::~string(local_100);
    if (bVar1) {
      this->m_type = this->m_type | 4;
    }
    bVar1 = std::operator==(str,",");
    if (bVar1) {
      this->m_type = this->m_type | 8;
    }
    if (this->m_type != 0) break;
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void IOperatorReader::getWord(std::string &str) {
    char tempChar;
    std::string tempStr;
    bool first_flag= true;

    while((tempChar = this->m_ifs->get()) != EOF)
    {
        if(IDictionary::isOperator(tempChar))
        {
            str += tempChar;
        }
        else if(first_flag&&IDictionary::isBracket1l(tempChar))
        {
            str += tempChar;
            while((tempChar = this->m_ifs->get()) != EOF)
            {
                if(IDictionary::isBlankSep(tempChar))
                {
                    str+=tempChar;
                    if(tempChar=='\n')
                        str+='\n';
                }
                else
                    break;
            }
            do
            {
                if(IDictionary::isLetterOrNumberOrDL(tempChar))
                {
                    str+=tempChar;
                }
                else
                {
                    break;
                }
            }while((tempChar = this->m_ifs->get()) != EOF);
            if(!IDictionary::isBaseType(str.substr(1,str.length()-1)))
            {
                str="";
            }
            else
            {
                do
                {
                    if(IDictionary::isBlankSep(tempChar))
                    {
                        str+=tempChar;
                        if(tempChar=='\n')
                            str+='\n';
                    }
                    else
                        break;
                }while((tempChar = this->m_ifs->get()) != EOF);
                if(IDictionary::isBracket1r(tempChar))
                {
                    str += tempChar;
                    m_type|=2;
                    break;
                }
                else
                    str="";
            }
        }
        else
        {
            break;
        }
        first_flag= false;
    }

    tempStr=str;
    int maxLen=tempStr.length();

    for(int i=0;i<maxLen;i++)
    {
        str=tempStr.substr(0,maxLen-i);
        if(IDictionary::isOperator0(str))
        {
            m_type|=1;
        }
        if(IDictionary::isOperator1(str))
        {
            m_type|=2;
        }
        if(IDictionary::isOperator2(str))
        {
            m_type|=4;
        }
        if(str==",")
        {
            m_type|=8;
        }
        if(m_type)
            break;
    }
}